

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O2

int __thiscall
coda_url::create_relative(coda_url *this,char *u,size_t sz,uint32_t flags,coda_url *parent)

{
  int iVar1;
  char *pcVar2;
  
  if ((((u != (char *)0x0) && (sz != 0)) && (this->val_len == 0)) && ((ulong)parent->val_len != 0))
  {
    pcVar2 = (char *)malloc((ulong)parent->dom_len + (ulong)parent->val_len + sz * 2 + 2);
    this->val_str = pcVar2;
    pcVar2 = coda_strxstr(u,"http://",7);
    if ((pcVar2 == (char *)0x0) && (pcVar2 = coda_strxstr(u,"https://",8), pcVar2 == (char *)0x0)) {
      iVar1 = create_suburl(this,u,sz,flags,parent);
      if (iVar1 != -1) {
        return 0;
      }
    }
    else {
      create_scheme(this,u,sz,flags);
      if ((flags & 2) == 0) {
        return 0;
      }
      iVar1 = strcasecmp(this->dom_str,parent->dom_str);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  reset(this);
  return -1;
}

Assistant:

int coda_url::create_relative(const char *u, size_t sz, uint32_t flags, const coda_url &parent)
{
	if (!empty() || 0 == sz || NULL == u || parent.empty())
	{
		reset();
		return -1;
	}

	val_str = (char *) malloc(2 + 2 * sz + parent.val_len + parent.dom_len); // if relative, parent may be bigger than u

	if (coda_strxstr(u, "http://", 7) || coda_strxstr(u, "https://", 8))
	{
		create_scheme(u, sz, flags);

		if ((flags & CODA_URL_SUBDOMAIN) && 0 != strcasecmp(dom_str, parent.dom_str))
		{
			reset();
			return -1;
		}
	}
	else
	{
		if (-1 == create_suburl(u, sz, flags, parent))
		{
			reset();
			return -1;
		}
	}

	return 0;
}